

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall ghc::filesystem::path::postprocess_path_with_format(path *this,format fmt)

{
  char *pcVar1;
  ulong uVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  
  pcVar1 = (this->_path)._M_dataplus._M_p;
  uVar2 = (this->_path)._M_string_length;
  if ((((uVar2 < 3) || (*pcVar1 != '/')) || (pcVar1[1] != '/')) || (pcVar1[2] == '/')) {
    _Var3 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                      (pcVar1,pcVar1 + uVar2);
  }
  else {
    _Var3 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                      (pcVar1 + 2,pcVar1 + uVar2);
  }
  std::__cxx11::string::erase
            (this,_Var3._M_current,(this->_path)._M_dataplus._M_p + (this->_path)._M_string_length);
  return;
}

Assistant:

GHC_INLINE void path::postprocess_path_with_format(path::format fmt)
{
#ifdef GHC_RAISE_UNICODE_ERRORS
    if (!detail::validUtf8(_path)) {
        path t;
        t._path = _path;
        throw filesystem_error("Illegal byte sequence for unicode character.", t, std::make_error_code(std::errc::illegal_byte_sequence));
    }
#endif
    switch (fmt) {
#ifdef GHC_OS_WINDOWS
        case path::native_format:
        case path::auto_format:
        case path::generic_format:
            for (auto& c : _path) {
                if (c == generic_separator) {
                    c = preferred_separator;
                }
            }
#ifdef GHC_WIN_AUTO_PREFIX_LONG_PATH
            if (is_absolute() && _path.length() >= MAX_PATH - 12 && !detail::startsWith(_path, impl_string_type(GHC_PLATFORM_LITERAL("\\\\?\\")))) {
                _path = GHC_PLATFORM_LITERAL("\\\\?\\") + _path;
            }
#endif
            handle_prefixes();
            break;
#else
        case path::auto_format:
        case path::native_format:
        case path::generic_format:
            // nothing to do
            break;
#endif
    }
    if (_path.length() > _prefixLength + 2 && _path[_prefixLength] == preferred_separator && _path[_prefixLength + 1] == preferred_separator && _path[_prefixLength + 2] != preferred_separator) {
        impl_string_type::iterator new_end = std::unique(_path.begin() + static_cast<string_type::difference_type>(_prefixLength) + 2, _path.end(), [](path::value_type lhs, path::value_type rhs) { return lhs == rhs && lhs == preferred_separator; });
        _path.erase(new_end, _path.end());
    }
    else {
        impl_string_type::iterator new_end = std::unique(_path.begin() + static_cast<string_type::difference_type>(_prefixLength), _path.end(), [](path::value_type lhs, path::value_type rhs) { return lhs == rhs && lhs == preferred_separator; });
        _path.erase(new_end, _path.end());
    }
}